

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::CatchScopeWalker::Get(CatchScopeWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  Type *pTVar7;
  PropertyRecord *pPVar8;
  RecyclableObject *this_00;
  ArenaAllocator *alloc;
  RecyclableObjectDisplay *this_01;
  Type TVar9;
  undefined1 auStack_48 [8];
  DebuggerScopeProperty scopeProperty;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b4,"(pResolvedObject)","pResolvedObject");
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  if (this->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b6,"(pFrame)","pFrame");
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  iVar4 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar4);
  if ((((this->debuggerScope->scopeProperties).ptr)->
      super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count <= i)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b8,"(i < (int)GetChildrenCount())","i < (int)GetChildrenCount()"
                               );
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  pTVar7 = JsUtil::
           List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((this->debuggerScope->scopeProperties).ptr,i);
  auStack_48._0_4_ = pTVar7->propId;
  auStack_48._4_4_ = pTVar7->location;
  scopeProperty.propId = pTVar7->byteCodeInitializationOffset;
  scopeProperty.location = pTVar7->flags;
  pResolvedObject->propId = auStack_48._0_4_;
  pPVar8 = ScriptContext::GetPropertyName(pResolvedObject->scriptContext,auStack_48._0_4_);
  pResolvedObject->name = (LPCWSTR)(pPVar8 + 1);
  FetchValueAndAddress
            (this,(DebuggerScopeProperty *)auStack_48,&pResolvedObject->obj,
             &pResolvedObject->address);
  if (pResolvedObject->obj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6c4,"(pResolvedObject->obj)","pResolvedObject->obj");
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  aValue = pResolvedObject->obj;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  scopeProperty._8_8_ = this;
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_008c13c6;
    *puVar6 = 0;
  }
  uVar2 = scopeProperty._8_8_;
  TVar9 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar9 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_008c13c6;
      *puVar6 = 0;
    }
    TVar9 = ((this_00->type).ptr)->typeId;
    if (0x57 < (int)TVar9) {
      BVar5 = RecyclableObject::IsExternal(this_00);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_008c13c6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
  }
  pResolvedObject->typeId = TVar9;
  alloc = (ArenaAllocator *)(**(code **)(**(long **)(uVar2 + 8) + 0x70))();
  this_01 = (RecyclableObjectDisplay *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
  RecyclableObjectDisplay::RecyclableObjectDisplay(this_01,pResolvedObject,0);
  pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_01;
  return 1;
}

Assistant:

BOOL CatchScopeWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        Assert(pFrame);
        pResolvedObject->scriptContext = pFrame->GetScriptContext();
        Assert(i < (int)GetChildrenCount());
        Js::DebuggerScopeProperty scopeProperty = debuggerScope->scopeProperties->Item(i);

        pResolvedObject->propId = scopeProperty.propId;

        const Js::PropertyRecord* propertyRecord = pResolvedObject->scriptContext->GetPropertyName(pResolvedObject->propId);

        // TODO: If this is a symbol-keyed property, we should indicate that in the name - "Symbol (description)"
        pResolvedObject->name = propertyRecord->GetBuffer();

        FetchValueAndAddress(scopeProperty, &pResolvedObject->obj, &pResolvedObject->address);

        Assert(pResolvedObject->obj);

        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay =  Anew(pFrame->GetArena(), RecyclableObjectDisplay, pResolvedObject);

        return TRUE;
    }